

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.h
# Opt level: O2

int __thiscall axl::io::SimpleMappedFile::close(SimpleMappedFile *this,int __fd)

{
  int iVar1;
  
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)this,__fd);
  iVar1 = Mapping::close(&this->m_mapping,__fd);
  this->m_openFlags = 0;
  return iVar1;
}

Assistant:

void
	close() {
		m_file.close();
		m_mapping.close();
		m_openFlags = 0;
	}